

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O1

bool jessilib::hex_shrink_sequence_action<char16_t,4ul,true,true>
               (char16_t **in_write_head,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> *read_view)

{
  size_t sVar1;
  char16_t *pcVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  sVar1 = read_view->_M_len;
  if (sVar1 == 0) {
    uVar5 = 0;
    bVar9 = false;
  }
  else {
    uVar3 = 3;
    if (sVar1 - 1 < 3) {
      uVar3 = sVar1 - 1;
    }
    uVar5 = 0;
    lVar6 = 0;
    do {
      uVar8 = (ulong)(ushort)read_view->_M_str[lVar6];
      uVar4 = 0xffffffff;
      if ((uVar8 < 0x80) && (uVar4 = (uint)(byte)base_table[uVar8], 0xf < uVar4)) {
        uVar4 = 0xffffffff;
      }
      lVar7 = lVar6;
      if ((int)uVar4 < 0) break;
      uVar5 = uVar4 | uVar5 << 4;
      lVar6 = lVar6 + 1;
      lVar7 = uVar3 + 1;
    } while (uVar3 + 1 != lVar6);
    bVar9 = lVar7 == 4;
  }
  if (bVar9 != false) {
    read_view->_M_str = read_view->_M_str + 4;
    read_view->_M_len = sVar1 - 4;
    pcVar2 = *in_write_head;
    if (uVar5 < 0x110000) {
      if (uVar5 < 0x10000) {
        *pcVar2 = (char16_t)uVar5;
        lVar6 = 1;
      }
      else {
        *pcVar2 = (short)(uVar5 + 0x3ff0000 >> 10) + L'\xd800';
        pcVar2[1] = (char16_t)uVar5 & 0x3ffU | 0xdc00;
        lVar6 = 2;
      }
    }
    else {
      lVar6 = 0;
    }
    *in_write_head = pcVar2 + lVar6;
  }
  return bVar9;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}